

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddTargetItem
          (cmComputeLinkInformation *this,string *item,cmGeneratorTarget *target)

{
  bool bVar1;
  TargetType TVar2;
  ulong uVar3;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar4;
  bool local_91;
  bool local_81;
  _Self local_80 [3];
  byte local_61;
  string local_60;
  _Self local_40;
  bool local_31;
  _Base_ptr local_30;
  undefined1 local_28;
  cmGeneratorTarget *local_20;
  cmGeneratorTarget *target_local;
  string *item_local;
  cmComputeLinkInformation *this_local;
  
  local_20 = target;
  target_local = (cmGeneratorTarget *)item;
  item_local = (string *)this;
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 != STATIC_LIBRARY) {
    SetCurrentLinkType(this,LinkShared);
  }
  TVar2 = cmGeneratorTarget::GetType(local_20);
  if (TVar2 == SHARED_LIBRARY) {
    pVar4 = std::
            set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
            ::insert(&this->SharedLibrariesLinked,&local_20);
    local_30 = (_Base_ptr)pVar4.first._M_node;
    local_28 = pVar4.second;
  }
  if (((this->NoSONameUsesPath & 1U) == 0) ||
     (bVar1 = cmGeneratorTarget::IsImportedSharedLibWithoutSOName(local_20,&this->Config), !bVar1))
  {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      local_31 = false;
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<std::__cxx11::string&,bool>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,&this->LibLinkFileFlag,&local_31);
    }
    local_61 = 0;
    local_91 = false;
    if ((this->OldLinkDirMode & 1U) != 0) {
      bVar1 = cmGeneratorTarget::IsFrameworkOnApple(local_20);
      local_91 = false;
      if (!bVar1) {
        cmsys::SystemTools::GetFilenamePath(&local_60,(string *)target_local);
        local_61 = 1;
        local_40._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&this->OldLinkDirMask,&local_60);
        local_80[0]._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->OldLinkDirMask);
        local_91 = std::operator==(&local_40,local_80);
      }
    }
    if ((local_61 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_60);
    }
    if (local_91 != false) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->OldLinkDirItems,(value_type *)target_local);
    }
    local_81 = true;
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<std::__cxx11::string_const&,bool,cmGeneratorTarget_const*&>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       target_local,&local_81,&local_20);
  }
  else {
    AddSharedLibNoSOName(this,(string *)target_local);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddTargetItem(std::string const& item,
                                             cmGeneratorTarget const* target)
{
  // This is called to handle a link item that is a full path to a target.
  // If the target is not a static library make sure the link type is
  // shared.  This is because dynamic-mode linking can handle both
  // shared and static libraries but static-mode can handle only
  // static libraries.  If a previous user item changed the link type
  // to static we need to make sure it is back to shared.
  if (target->GetType() != cmStateEnums::STATIC_LIBRARY) {
    this->SetCurrentLinkType(LinkShared);
  }

  // Keep track of shared library targets linked.
  if (target->GetType() == cmStateEnums::SHARED_LIBRARY) {
    this->SharedLibrariesLinked.insert(target);
  }

  // Handle case of an imported shared library with no soname.
  if (this->NoSONameUsesPath &&
      target->IsImportedSharedLibWithoutSOName(this->Config)) {
    this->AddSharedLibNoSOName(item);
    return;
  }

  // If this platform wants a flag before the full path, add it.
  if (!this->LibLinkFileFlag.empty()) {
    this->Items.emplace_back(this->LibLinkFileFlag, false);
  }

  // For compatibility with CMake 2.4 include the item's directory in
  // the linker search path.
  if (this->OldLinkDirMode && !target->IsFrameworkOnApple() &&
      this->OldLinkDirMask.find(cmSystemTools::GetFilenamePath(item)) ==
        this->OldLinkDirMask.end()) {
    this->OldLinkDirItems.push_back(item);
  }

  // Now add the full path to the library.
  this->Items.emplace_back(item, true, target);
}